

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<unsigned_short>
          (BaseDictionary<unsigned_short,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,unsigned_short *key,int *value)

{
  Type piVar1;
  hash_t hVar2;
  Type this_00;
  uint uVar3;
  uint depth;
  
  piVar1 = this->buckets;
  depth = 0;
  if (piVar1 != (Type)0x0) {
    hVar2 = PrimePolicy::ModPrime((uint)*key,this->bucketCount,this->modFunctionIndex);
    uVar3 = piVar1[hVar2];
    depth = 0;
    if (-1 < (int)uVar3) {
      depth = 0;
      do {
        if (this->entries[uVar3].
            super_DefaultHashedEntry<unsigned_short,_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_short,_int>.
            super_ValueEntry<int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_short,_int>_>
            .super_KeyValueEntryDataLayout2<unsigned_short,_int>.key == *key) {
          this_00 = this->stats;
          goto LAB_0055fef4;
        }
        depth = depth + 1;
        uVar3 = this->entries[uVar3].
                super_DefaultHashedEntry<unsigned_short,_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_short,_int>.
                super_ValueEntry<int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_short,_int>_>
                .super_KeyValueEntryDataLayout2<unsigned_short,_int>.next;
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = this->stats;
  uVar3 = 0xffffffff;
LAB_0055fef4:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  if (-1 < (int)uVar3) {
    *value = this->entries[uVar3].
             super_DefaultHashedEntry<unsigned_short,_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<unsigned_short,_int>.
             super_ValueEntry<int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_short,_int>_>
             .super_KeyValueEntryDataLayout2<unsigned_short,_int>.value;
  }
  return -1 < (int)uVar3;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }